

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O3

string * __thiscall
iqxmlrpc::Value::get_string_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  pointer pcVar1;
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pSVar2;
  
  pSVar2 = cast<iqxmlrpc::Scalar<std::__cxx11::string>>(this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pSVar2->value_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (pSVar2->value_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::get_string() const
{
  return cast<String>()->value();
}